

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate.c
# Opt level: O3

parser_error parse_vault_name(parser *p)

{
  void *pvVar1;
  undefined8 *v;
  char *pcVar2;
  
  pvVar1 = parser_priv(p);
  v = (undefined8 *)mem_zalloc(0x28);
  pcVar2 = parser_getstr(p,"name");
  pcVar2 = string_make(pcVar2);
  v[1] = pcVar2;
  *v = pvVar1;
  parser_setpriv(p,v);
  return PARSE_ERROR_NONE;
}

Assistant:

static enum parser_error parse_vault_name(struct parser *p) {
	struct vault *h = parser_priv(p);
	struct vault *v = mem_zalloc(sizeof *v);

	v->name = string_make(parser_getstr(p, "name"));
	v->next = h;
	parser_setpriv(p, v);
	return PARSE_ERROR_NONE;
}